

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall Variable_variableMethods_Test::TestBody(Variable_variableMethods_Test *this)

{
  char *pcVar1;
  shared_ptr<libcellml::Variable> local_190;
  AssertionResult gtest_ar_5;
  allocator<char> local_169;
  AssertionResult gtest_ar_3;
  ComponentPtr c;
  string a1;
  string a4;
  string a3;
  VariablePtr vMethod4;
  string a2;
  void *local_a8;
  VariablePtr vMethod3;
  VariablePtr vMethod2;
  VariablePtr vMethod1;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  string in;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,"valid_name",(allocator<char> *)&a1);
  libcellml::Component::create();
  libcellml::NamedEntity::setName
            ((string *)c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Variable::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a1,"variable1",(allocator<char> *)&a2);
  libcellml::NamedEntity::setName
            ((string *)v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&a1);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a1,"variable2",(allocator<char> *)&a2);
  libcellml::NamedEntity::setName
            ((string *)v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&a1);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a1,"variable3",(allocator<char> *)&a2);
  libcellml::NamedEntity::setName
            ((string *)v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&a1);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a1,"variable4",(allocator<char> *)&a2);
  libcellml::NamedEntity::setName
            ((string *)v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&a1);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a1,"variable1",(allocator<char> *)&a2);
  libcellml::Component::variable((string *)&vMethod1);
  std::__cxx11::string::~string((string *)&a1);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&a2,"\"variable1\"","a1",(char (*) [10])"variable1",&a1);
  if ((char)a2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&a3);
    if (a2._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)a2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&a4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2fc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&a4,(Message *)&a3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&a4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2._M_string_length);
  libcellml::Component::variable((ulong)&vMethod2);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&a3,"\"variable2\"","a2",(char (*) [10])"variable2",&a2);
  if ((char)a3._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&a4);
    if (a3._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)a3._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x301,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&a4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a3._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a3,"variable3",(allocator<char> *)&a4);
  libcellml::Component::variable((string *)&vMethod3);
  std::__cxx11::string::~string((string *)&a3);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&a4,"\"variable3\"","a3",(char (*) [10])"variable3",&a3);
  if ((char)a4._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (a4._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)a4._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vMethod4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x306,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vMethod4,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vMethod4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a4._M_string_length);
  libcellml::Component::variable((ulong)&vMethod4);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"variable4\"","a4",(char (*) [10])"variable4",&a4);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x30b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  local_190.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  libcellml::Component::variable((ulong)&gtest_ar_5);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            ((internal *)&gtest_ar_3,"nullptr","c->variable(7)",(void **)&local_190,
             (shared_ptr<libcellml::Variable> *)&gtest_ar_5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_5.message_);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x30e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  local_a8 = (void *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_3,"doesntexist",&local_169)
  ;
  libcellml::Component::variable((string *)&local_190);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            ((internal *)&gtest_ar_5,"nullptr","c->variable(\"doesntexist\")",&local_a8,&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_190.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x311,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  std::__cxx11::string::~string((string *)&a4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vMethod4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&a3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vMethod3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&a2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vMethod2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&a1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vMethod1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Variable, variableMethods)
{
    const std::string in = "valid_name";
    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName(in);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("variable1");
    c->addVariable(v1);
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("variable2");
    c->addVariable(v2);
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("variable3");
    c->addVariable(v3);
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    v4->setName("variable4");
    c->addVariable(v4);

    // Get by string
    libcellml::VariablePtr vMethod1 = c->variable("variable1");
    const std::string a1 = vMethod1->name();
    EXPECT_EQ("variable1", a1);

    // Get by index
    libcellml::VariablePtr vMethod2 = c->variable(1);
    const std::string a2 = vMethod2->name();
    EXPECT_EQ("variable2", a2);

    // Get const by string
    const libcellml::VariablePtr vMethod3 = c->variable("variable3");
    const std::string a3 = vMethod3->name();
    EXPECT_EQ("variable3", a3);

    // Get const by index
    const libcellml::VariablePtr vMethod4 = c->variable(3);
    const std::string a4 = vMethod4->name();
    EXPECT_EQ("variable4", a4);

    // Get invalid index
    EXPECT_EQ(nullptr, c->variable(7));

    // Get non-existent variable by string
    EXPECT_EQ(nullptr, c->variable("doesntexist"));
}